

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dasm_x86.h
# Opt level: O0

void dasm_init(BuildCtx *ctx,int maxsection)

{
  long lVar1;
  dasm_State *pdVar2;
  size_t _need;
  size_t _sz;
  size_t sStack_28;
  int i;
  size_t psz;
  dasm_State *D;
  int maxsection_local;
  BuildCtx *ctx_local;
  
  sStack_28 = 0;
  ctx->D = (dasm_State *)0x0;
  lVar1 = (long)(maxsection + -1) * 0x28;
  if (lVar1 != -0x78) {
    for (_need = 0x10; _need < lVar1 + 0x78U; _need = _need * 2) {
    }
    pdVar2 = (dasm_State *)realloc(ctx->D,_need);
    ctx->D = pdVar2;
    if (ctx->D == (dasm_State *)0x0) {
      exit(1);
    }
    sStack_28 = _need;
  }
  pdVar2 = ctx->D;
  pdVar2->psize = sStack_28;
  pdVar2->lglabels = (int *)0x0;
  pdVar2->lgsize = 0;
  pdVar2->pclabels = (int *)0x0;
  pdVar2->pcsize = 0;
  pdVar2->globals = (void **)0x0;
  pdVar2->maxsection = maxsection;
  for (_sz._4_4_ = 0; _sz._4_4_ < maxsection; _sz._4_4_ = _sz._4_4_ + 1) {
    pdVar2->sections[_sz._4_4_].buf = (int *)0x0;
    pdVar2->sections[_sz._4_4_].rbuf = pdVar2->sections[_sz._4_4_].buf + -(long)(_sz._4_4_ << 0x18);
    pdVar2->sections[_sz._4_4_].bsize = 0;
    pdVar2->sections[_sz._4_4_].epos = 0;
  }
  return;
}

Assistant:

void dasm_init(Dst_DECL, int maxsection)
{
  dasm_State *D;
  size_t psz = 0;
  int i;
  Dst_REF = NULL;
  DASM_M_GROW(Dst, struct dasm_State, Dst_REF, psz, DASM_PSZ(maxsection));
  D = Dst_REF;
  D->psize = psz;
  D->lglabels = NULL;
  D->lgsize = 0;
  D->pclabels = NULL;
  D->pcsize = 0;
  D->globals = NULL;
  D->maxsection = maxsection;
  for (i = 0; i < maxsection; i++) {
    D->sections[i].buf = NULL;  /* Need this for pass3. */
    D->sections[i].rbuf = D->sections[i].buf - DASM_SEC2POS(i);
    D->sections[i].bsize = 0;
    D->sections[i].epos = 0;  /* Wrong, but is recalculated after resize. */
  }
}